

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O1

void __thiscall
QDBusConnectionPrivate::setConnection
          (QDBusConnectionPrivate *this,DBusConnection *dbc,QDBusErrorInternal *error)

{
  SignalHookHash *this_00;
  char *pcVar1;
  QList<QMetaType> *this_01;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QMetaType this_02;
  int iVar5;
  long lVar6;
  storage_type *psVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  SignalHook hook;
  QMetaMethodReturnArgument local_158;
  char *local_140;
  QDebug local_130;
  QMetaType local_128;
  QMetaType local_120;
  SignalHook local_118;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->mode = ClientMode;
  if (dbc == (DBusConnection *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      handleError(this,error);
      return;
    }
  }
  else {
    (this->field_7).connection = dbc;
    lVar6 = dbus_bus_get_unique_name(dbc);
    if (lVar6 == 0) {
      psVar8 = (storage_type *)0x0;
    }
    else {
      psVar7 = (storage_type *)0xffffffffffffffff;
      do {
        psVar8 = psVar7 + 1;
        pcVar1 = psVar7 + lVar6 + 1;
        psVar7 = psVar8;
      } while (*pcVar1 != '\0');
    }
    QVar9.m_data = psVar8;
    QVar9.m_size = (qsizetype)&local_118;
    QString::fromUtf8(QVar9);
    pQVar2 = &((this->baseService).d.d)->super_QArrayData;
    pcVar3 = (this->baseService).d.ptr;
    *(undefined4 *)&(this->baseService).d.d = local_118.service.d.d._0_4_;
    *(undefined4 *)((long)&(this->baseService).d.d + 4) = local_118.service.d.d._4_4_;
    *(undefined4 *)&(this->baseService).d.ptr = local_118.service.d.ptr._0_4_;
    *(undefined4 *)((long)&(this->baseService).d.ptr + 4) = local_118.service.d.ptr._4_4_;
    qVar4 = (this->baseService).d.size;
    (this->baseService).d.size = local_118.service.d.size;
    local_118.service.d.d = (Data *)pQVar2;
    local_118.service.d.ptr = pcVar3;
    local_118.service.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    iVar5 = dbus_connection_can_send_type((this->field_7).connection,0x68);
    (this->capabilities).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = (uint)(iVar5 != 0);
    this->isAuthenticated = true;
    dbus_connection_set_exit_on_disconnect((this->field_7).connection,0);
    dbus_connection_set_watch_functions
              ((this->field_7).connection,qDBusAddWatch,qDBusRemoveWatch,qDBusToggleWatch,this,0);
    dbus_connection_set_timeout_functions
              ((this->field_7).connection,qDBusAddTimeout,qDBusRemoveTimeout,qDBusToggleTimeout,this
               ,0);
    dbus_connection_set_dispatch_status_function
              ((this->field_7).connection,qDBusUpdateDispatchStatus,this,0);
    dbus_connection_add_filter((this->field_7).connection,qDBusSignalFilter,this,0);
    memset(&local_118,0xaa,0xb8);
    this_01 = &local_118.params;
    local_118.matchRule.d.size = 0;
    local_118.matchRule.d.ptr = (char *)0x0;
    local_118.matchRule.d.d = (Data *)0x0;
    local_118.argumentMatch.arg0namespace.d.size = 0;
    local_118.argumentMatch.arg0namespace.d.ptr = (char16_t *)0x0;
    local_118.argumentMatch.arg0namespace.d.d = (Data *)0x0;
    local_118.argumentMatch.args.d.size = 0;
    local_118.argumentMatch.args.d.ptr = (QString *)0x0;
    local_118.argumentMatch.args.d.d = (Data *)0x0;
    local_118.params.d.size = 0;
    local_118.params.d.ptr = (QMetaType *)0x0;
    local_118.params.d.d = (Data *)0x0;
    local_118.midx = -1;
    local_118.signature.d.size = 0;
    local_118.signature.d.ptr = (char16_t *)0x0;
    local_118.signature.d.d = (Data *)0x0;
    local_118.path.d.size = 0;
    local_118.path.d.ptr = (char16_t *)0x0;
    local_118.path.d.d = (Data *)0x0;
    local_118.service.d.size = 0x14;
    local_118.service.d.ptr = L"org.freedesktop.DBus";
    local_118.service.d.d = (Data *)0x0;
    local_118.obj = &this->super_QObject;
    QMetaType::QMetaType((QMetaType *)&local_158,0x2b);
    QtPrivate::QMovableArrayOps<QMetaType>::emplace<QMetaType>
              ((QMovableArrayOps<QMetaType> *)this_01,local_118.params.d.size,
               (QMetaType *)&local_158);
    QList<QMetaType>::end(this_01);
    QMetaType::QMetaType((QMetaType *)&local_58,10);
    QtPrivate::QMovableArrayOps<QMetaType>::emplace<QMetaType>
              ((QMovableArrayOps<QMetaType> *)this_01,local_118.params.d.size,(QMetaType *)&local_58
              );
    QList<QMetaType>::end(this_01);
    local_118.midx = QMetaObject::indexOfSlot((char *)&staticMetaObject);
    this_00 = &this->signalHooks;
    QVar10.m_data = (storage_type *)0x21;
    QVar10.m_size = (qsizetype)&local_158;
    QString::fromLatin1(QVar10);
    local_58.d.d = (Data *)CONCAT44(local_158.metaType._4_4_,local_158.metaType._0_4_);
    QMultiHash<QString,QDBusConnectionPrivate::SignalHook>::
    emplace<QDBusConnectionPrivate::SignalHook_const&>
              ((iterator *)&local_158,this_00,&local_58,&local_118);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_118.midx = QMetaObject::indexOfSlot((char *)&staticMetaObject);
    QVar11.m_data = (storage_type *)0x1d;
    QVar11.m_size = (qsizetype)&local_158;
    QString::fromLatin1(QVar11);
    local_58.d.d = (Data *)CONCAT44(local_158.metaType._4_4_,local_158.metaType._0_4_);
    QMultiHash<QString,QDBusConnectionPrivate::SignalHook>::
    emplace<QDBusConnectionPrivate::SignalHook_const&>
              ((iterator *)&local_158,this_00,&local_58,&local_118);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    QList<QMetaType>::clear(this_01);
    QList<QMetaType>::reserve(this_01,4);
    QMetaType::QMetaType((QMetaType *)&local_158,0x2b);
    QtPrivate::QMovableArrayOps<QMetaType>::emplace<QMetaType>
              ((QMovableArrayOps<QMetaType> *)this_01,local_118.params.d.size,
               (QMetaType *)&local_158);
    QList<QMetaType>::end(this_01);
    QMetaType::QMetaType((QMetaType *)&local_58,10);
    QtPrivate::QMovableArrayOps<QMetaType>::emplace<QMetaType>
              ((QMovableArrayOps<QMetaType> *)this_01,local_118.params.d.size,(QMetaType *)&local_58
              );
    QList<QMetaType>::end(this_01);
    QMetaType::QMetaType(&local_120,10);
    QtPrivate::QMovableArrayOps<QMetaType>::emplace<QMetaType>
              ((QMovableArrayOps<QMetaType> *)this_01,local_118.params.d.size,&local_120);
    QList<QMetaType>::end(this_01);
    QMetaType::QMetaType(&local_128,10);
    QtPrivate::QMovableArrayOps<QMetaType>::emplace<QMetaType>
              ((QMovableArrayOps<QMetaType> *)this_01,local_118.params.d.size,&local_128);
    QList<QMetaType>::end(this_01);
    local_118.midx = QMetaObject::indexOfSlot((char *)&staticMetaObject);
    QVar12.m_data = (storage_type *)0x25;
    QVar12.m_size = (qsizetype)&local_158;
    QString::fromLatin1(QVar12);
    local_58.d.d = (Data *)CONCAT44(local_158.metaType._4_4_,local_158.metaType._0_4_);
    QMultiHash<QString,QDBusConnectionPrivate::SignalHook>::
    emplace<QDBusConnectionPrivate::SignalHook_const&>
              ((iterator *)&local_158,this_00,&local_58,&local_118);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    watchForDBusDisconnection(this);
    if ((__atomic_base<int>)isDebugging._q_value.super___atomic_base<int>._M_i !=
        (__atomic_base<int>)0x0) {
      local_158.metaType._0_4_ = 2;
      local_158.metaType._4_4_ = 0;
      local_158.name._0_4_ = 0;
      local_158.name._4_4_ = 0;
      local_158.data._0_4_ = 0;
      local_158.data._4_4_ = 0;
      local_140 = "default";
      QMessageLogger::debug();
      ::operator<<((Stream *)&local_120,(QObject *)&local_130);
      this_02.d_ptr = local_120.d_ptr;
      QVar13.m_data = (storage_type *)0x18;
      QVar13.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<((QTextStream *)this_02.d_ptr,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(char *)&(local_120.d_ptr)->moveCtr == '\x01') {
        QTextStream::operator<<((QTextStream *)local_120.d_ptr,' ');
      }
      QDebug::~QDebug((QDebug *)&local_120);
      QDebug::~QDebug(&local_130);
    }
    local_58.d.d = (Data *)doDispatch;
    local_58.d.ptr = (char16_t *)0x0;
    local_158.metaType._0_4_ = 0x1c06d0;
    local_158.metaType._4_4_ = 0;
    local_158.name._0_4_ = 0;
    local_158.name._4_4_ = 0;
    local_158.data._0_4_ = 0;
    local_158.data._4_4_ = 0;
    QMetaObject::invokeMethodCallableHelper<void(QDBusConnectionPrivate::*)()>
              (this,(offset_in_QDBusConnectionPrivate_to_subr *)&local_58,QueuedConnection,
               &local_158);
    SignalHook::~SignalHook(&local_118);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDBusConnectionPrivate::setConnection(DBusConnection *dbc, const QDBusErrorInternal &error)
{
    mode = ClientMode;
    if (!dbc) {
        handleError(error);
        return;
    }

    connection = dbc;

    const char *service = q_dbus_bus_get_unique_name(connection);
    Q_ASSERT(service);
    baseService = QString::fromUtf8(service);
    // bus connections are already authenticated here because q_dbus_bus_register() has been called
    handleAuthentication();

    q_dbus_connection_set_exit_on_disconnect(connection, false);
    q_dbus_connection_set_watch_functions(connection, qDBusAddWatch, qDBusRemoveWatch,
                                          qDBusToggleWatch, this, nullptr);
    q_dbus_connection_set_timeout_functions(connection, qDBusAddTimeout, qDBusRemoveTimeout,
                                            qDBusToggleTimeout, this, nullptr);
    q_dbus_connection_set_dispatch_status_function(connection, qDBusUpdateDispatchStatus, this, nullptr);
    q_dbus_connection_add_filter(connection, qDBusSignalFilter, this, nullptr);

    // Initialize the hooks for the NameAcquired and NameLost signals
    // we don't use connectSignal here because we don't need the rules to be sent to the bus
    // the bus will always send us these two signals
    SignalHook hook;
    hook.service = QDBusUtil::dbusService();
    hook.path.clear(); // no matching
    hook.obj = this;
    hook.params << QMetaType(QMetaType::Void) << QMetaType(QMetaType::QString); // both functions take a QString as parameter and return void

    hook.midx = staticMetaObject.indexOfSlot("registerServiceNoLock(QString)");
    Q_ASSERT(hook.midx != -1);
    signalHooks.insert("NameAcquired:" DBUS_INTERFACE_DBUS ""_L1, hook);

    hook.midx = staticMetaObject.indexOfSlot("unregisterServiceNoLock(QString)");
    Q_ASSERT(hook.midx != -1);
    signalHooks.insert("NameLost:" DBUS_INTERFACE_DBUS ""_L1, hook);

    // And initialize the hook for the NameOwnerChanged signal;
    // we don't use connectSignal here because the rules are added by connectSignal on a per-need basis
    hook.params.clear();
    hook.params.reserve(4);
    hook.params << QMetaType(QMetaType::Void) << QMetaType(QMetaType::QString) << QMetaType(QMetaType::QString) << QMetaType(QMetaType::QString);
    hook.midx = staticMetaObject.indexOfSlot("serviceOwnerChangedNoLock(QString,QString,QString)");
    Q_ASSERT(hook.midx != -1);
    signalHooks.insert("NameOwnerChanged:" DBUS_INTERFACE_DBUS ""_L1, hook);

    watchForDBusDisconnection();

    qDBusDebug() << this << ": connected successfully";

    // schedule a dispatch:
    QMetaObject::invokeMethod(this, &QDBusConnectionPrivate::doDispatch, Qt::QueuedConnection);
}